

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

void lz77_advance(LZ77InternalContext *st,uchar c,int hash)

{
  short sVar1;
  int off;
  int hash_local;
  uchar c_local;
  LZ77InternalContext *st_local;
  
  if (st->win[st->winpos].prev == -1) {
    if (st->win[st->winpos].hashval != -1) {
      st->hashtab[st->win[st->winpos].hashval].first = -1;
    }
  }
  else {
    st->win[st->win[st->winpos].prev].next = -1;
  }
  st->win[st->winpos].hashval = (short)hash;
  st->win[st->winpos].prev = -1;
  sVar1 = st->hashtab[hash].first;
  st->win[st->winpos].next = sVar1;
  st->hashtab[hash].first = (short)st->winpos;
  if (sVar1 != -1) {
    st->win[(int)sVar1].prev = (short)st->winpos;
  }
  st->data[st->winpos] = c;
  st->winpos = st->winpos + 1U & 0x7fff;
  return;
}

Assistant:

static void lz77_advance(struct LZ77InternalContext *st,
                         unsigned char c, int hash)
{
    int off;

    /*
     * Remove the hash entry at winpos from the tail of its chain,
     * or empty the chain if it's the only thing on the chain.
     */
    if (st->win[st->winpos].prev != INVALID) {
        st->win[st->win[st->winpos].prev].next = INVALID;
    } else if (st->win[st->winpos].hashval != INVALID) {
        st->hashtab[st->win[st->winpos].hashval].first = INVALID;
    }

    /*
     * Create a new entry at winpos and add it to the head of its
     * hash chain.
     */
    st->win[st->winpos].hashval = hash;
    st->win[st->winpos].prev = INVALID;
    off = st->win[st->winpos].next = st->hashtab[hash].first;
    st->hashtab[hash].first = st->winpos;
    if (off != INVALID)
        st->win[off].prev = st->winpos;
    st->data[st->winpos] = c;

    /*
     * Advance the window pointer.
     */
    st->winpos = (st->winpos + 1) & (WINSIZE - 1);
}